

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTextureUtil.cpp
# Opt level: O0

PixelBufferAccess *
glu::getTextureBufferEffectiveRefTexture
          (PixelBufferAccess *__return_storage_ptr__,TextureBuffer *buffer,int maxTextureBufferSize)

{
  int iVar1;
  TextureFormat *format;
  IVec3 *pitch;
  void *data;
  Vector<int,_3> local_5c;
  ConstPixelBufferAccess local_50;
  ConstPixelBufferAccess *local_28;
  PixelBufferAccess *fullAccess;
  TextureBuffer *pTStack_18;
  int maxTextureBufferSize_local;
  TextureBuffer *buffer_local;
  
  fullAccess._4_4_ = maxTextureBufferSize;
  pTStack_18 = buffer;
  buffer_local = (TextureBuffer *)__return_storage_ptr__;
  TextureBuffer::getFullRefTexture((PixelBufferAccess *)&local_50,buffer);
  local_28 = &local_50;
  format = tcu::ConstPixelBufferAccess::getFormat(local_28);
  iVar1 = tcu::ConstPixelBufferAccess::getWidth(local_28);
  iVar1 = de::min<int>(iVar1,fullAccess._4_4_);
  tcu::Vector<int,_3>::Vector(&local_5c,iVar1,1,1);
  pitch = tcu::ConstPixelBufferAccess::getPitch(local_28);
  data = tcu::PixelBufferAccess::getDataPtr((PixelBufferAccess *)local_28);
  tcu::PixelBufferAccess::PixelBufferAccess(__return_storage_ptr__,format,&local_5c,pitch,data);
  return __return_storage_ptr__;
}

Assistant:

tcu::PixelBufferAccess getTextureBufferEffectiveRefTexture (TextureBuffer& buffer, int maxTextureBufferSize)
{
	DE_ASSERT(maxTextureBufferSize > 0);

	const tcu::PixelBufferAccess& fullAccess = buffer.getFullRefTexture();

	return tcu::PixelBufferAccess(fullAccess.getFormat(),
								  tcu::IVec3(de::min(fullAccess.getWidth(), maxTextureBufferSize), 1, 1),
								  fullAccess.getPitch(),
								  fullAccess.getDataPtr());
}